

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

int __thiscall cmCPackIFWPackage::ConfigureFromPrefix(cmCPackIFWPackage *this,string *prefix)

{
  bool bVar1;
  cmValue cVar2;
  size_type sVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  pointer pbVar6;
  pointer dependence;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string option;
  DependenceStruct dep;
  cmList deps;
  cmList depsOn;
  mapped_type *local_38;
  
  option._M_dataplus._M_p = (pointer)&option.field_2;
  option._M_string_length = 0;
  option.field_2._M_local_buf[0] = '\0';
  std::operator+(&dep.Name,prefix,"DISPLAY_NAME");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&option);
  if (bVar1) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&(this->DisplayName)._M_t);
  }
  else {
    cVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&option);
    if (cVar2.Value != (string *)0x0) {
      cmCPackIFWCommon::ExpandListArgument(cVar2.Value,&this->DisplayName);
    }
  }
  std::operator+(&dep.Name,prefix,"DESCRIPTION");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&option);
  if (bVar1) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&(this->Description)._M_t);
  }
  else {
    cVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&option);
    if (cVar2.Value != (string *)0x0) {
      cmCPackIFWCommon::ExpandListArgument(cVar2.Value,&this->Description);
    }
  }
  std::operator+(&dep.Name,prefix,"RELEASE_DATE");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&option);
  if (bVar1) {
    (this->ReleaseDate)._M_string_length = 0;
    *(this->ReleaseDate)._M_dataplus._M_p = '\0';
  }
  else {
    cVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&option);
    if (cVar2.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ReleaseDate);
    }
  }
  std::operator+(&dep.Name,prefix,"SORTING_PRIORITY");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&option);
  if (bVar1) {
    (this->SortingPriority)._M_string_length = 0;
    *(this->SortingPriority)._M_dataplus._M_p = '\0';
  }
  else {
    cVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&option);
    if (cVar2.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->SortingPriority);
    }
  }
  std::operator+(&dep.Name,prefix,"UPDATE_TEXT");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&option);
  if (bVar1) {
    (this->UpdateText)._M_string_length = 0;
    *(this->UpdateText)._M_dataplus._M_p = '\0';
  }
  else {
    cVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&option);
    if (cVar2.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->UpdateText);
    }
  }
  std::operator+(&dep.Name,prefix,"TRANSLATIONS");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&option);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->Translations);
  }
  else {
    cVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&option);
    if (cVar2.Value != (string *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->Translations);
      cmList::append(&this->Translations,cVar2,No);
    }
  }
  deps.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deps.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deps.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&dep.Name,prefix,"DEPENDS");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  cVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&option);
  if (cVar2.Value != (string *)0x0) {
    cmList::assign(&deps,cVar2,Yes,No);
  }
  std::operator+(&dep.Name,prefix,"DEPENDENCIES");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  cVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&option);
  if (cVar2.Value != (string *)0x0) {
    cmList::append_abi_cxx11_(&deps,cVar2,Yes,No);
  }
  pbVar6 = deps.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (dependence = deps.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; dependence != pbVar6;
      dependence = dependence + 1) {
    DependenceStruct::DependenceStruct(&dep,dependence);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
            ::count(&((this->super_cmCPackIFWCommon).Generator)->Packages,&dep.Name);
    if (sVar3 != 0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
      ::operator[](&((this->super_cmCPackIFWCommon).Generator)->Packages,&dep.Name);
      std::__cxx11::string::_M_assign((string *)&dep);
    }
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
            ::count(&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,&dep.Name);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
             ::operator[](&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,&dep.Name);
    if (sVar4 == 0) {
      DependenceStruct::operator=(pmVar5,&dep);
    }
    depsOn.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = &pmVar5->Name;
    std::
    _Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
    ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct*>
              ((_Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
                *)&this->AlienDependencies,(DependenceStruct **)&depsOn);
    DependenceStruct::~DependenceStruct(&dep);
  }
  std::operator+(&dep.Name,prefix,"AUTO_DEPEND_ON");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&option);
  if (bVar1) {
    std::
    _Rb_tree<cmCPackIFWPackage::DependenceStruct_*,_cmCPackIFWPackage::DependenceStruct_*,_std::_Identity<cmCPackIFWPackage::DependenceStruct_*>,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
    ::clear(&(this->AlienAutoDependOn)._M_t);
  }
  else {
    cVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&option);
    if (cVar2.Value != (string *)0x0) {
      std::__cxx11::string::string((string *)&dep,(string *)cVar2.Value);
      init._M_len = 1;
      init._M_array = &dep.Name;
      cmList::cmList(&depsOn,init);
      std::__cxx11::string::~string((string *)&dep);
      for (pbVar6 = depsOn.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 != depsOn.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
        DependenceStruct::DependenceStruct(&dep,pbVar6);
        sVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                ::count(&((this->super_cmCPackIFWCommon).Generator)->Packages,&dep.Name);
        if (sVar3 != 0) {
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
          ::operator[](&((this->super_cmCPackIFWCommon).Generator)->Packages,&dep.Name);
          std::__cxx11::string::_M_assign((string *)&dep);
        }
        sVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                ::count(&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,&dep.Name);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                 ::operator[](&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,
                              &dep.Name);
        if (sVar4 == 0) {
          DependenceStruct::operator=(pmVar5,&dep);
        }
        local_38 = pmVar5;
        std::
        _Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
        ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct*>
                  ((_Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
                    *)&this->AlienAutoDependOn,&local_38);
        DependenceStruct::~DependenceStruct(&dep);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depsOn.Values);
    }
  }
  std::operator+(&dep.Name,prefix,"VIRTUAL");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&option);
  if (bVar1) {
    (this->Virtual)._M_string_length = 0;
    *(this->Virtual)._M_dataplus._M_p = '\0';
  }
  else {
    bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&option);
    if (bVar1) {
      std::__cxx11::string::assign((char *)&this->Virtual);
    }
  }
  std::operator+(&dep.Name,prefix,"DEFAULT");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&option);
  if (bVar1) {
    (this->Default)._M_string_length = 0;
    *(this->Default)._M_dataplus._M_p = '\0';
    goto LAB_001b15fc;
  }
  cVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&option);
  if (cVar2.Value == (string *)0x0) goto LAB_001b15fc;
  cmsys::SystemTools::LowerCase(&dep.Name,cVar2.Value);
  bVar1 = std::operator==(&dep.Name,"true");
  if ((bVar1) || (bVar1 = std::operator==(&dep.Name,"false"), bVar1)) {
LAB_001b15ea:
    std::__cxx11::string::assign((char *)&this->Default);
  }
  else {
    bVar1 = std::operator==(&dep.Name,"script");
    if (bVar1) goto LAB_001b15ea;
    std::__cxx11::string::_M_assign((string *)&this->Default);
  }
  std::__cxx11::string::~string((string *)&dep);
LAB_001b15fc:
  std::operator+(&dep.Name,prefix,"FORCED_INSTALLATION");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&option);
  if (bVar1) {
    (this->ForcedInstallation)._M_string_length = 0;
    *(this->ForcedInstallation)._M_dataplus._M_p = '\0';
  }
  else {
    bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&option);
    if ((bVar1) ||
       (bVar1 = cmCPackIFWCommon::IsSetToOff(&this->super_cmCPackIFWCommon,&option), bVar1)) {
      std::__cxx11::string::assign((char *)&this->ForcedInstallation);
    }
  }
  std::operator+(&dep.Name,prefix,"REPLACES");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&option);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->Replaces);
  }
  else {
    cVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&option);
    if (cVar2.Value != (string *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->Replaces);
      cmList::append(&this->Replaces,cVar2,No);
    }
  }
  std::operator+(&dep.Name,prefix,"REQUIRES_ADMIN_RIGHTS");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&option);
  if (bVar1) {
    (this->RequiresAdminRights)._M_string_length = 0;
    *(this->RequiresAdminRights)._M_dataplus._M_p = '\0';
  }
  else {
    bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&option);
    if ((bVar1) ||
       (bVar1 = cmCPackIFWCommon::IsSetToOff(&this->super_cmCPackIFWCommon,&option), bVar1)) {
      std::__cxx11::string::assign((char *)&this->RequiresAdminRights);
    }
  }
  std::operator+(&dep.Name,prefix,"CHECKABLE");
  std::__cxx11::string::operator=((string *)&option,(string *)&dep);
  std::__cxx11::string::~string((string *)&dep);
  bVar1 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&option);
  if (bVar1) {
    (this->Checkable)._M_string_length = 0;
    *(this->Checkable)._M_dataplus._M_p = '\0';
  }
  else {
    bVar1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&option);
    if ((bVar1) ||
       (bVar1 = cmCPackIFWCommon::IsSetToOff(&this->super_cmCPackIFWCommon,&option), bVar1)) {
      std::__cxx11::string::assign((char *)&this->Checkable);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&deps.Values);
  std::__cxx11::string::~string((string *)&option);
  return 1;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromPrefix(const std::string& prefix)
{
  // Temporary variable for full option name
  std::string option;

  // Display name
  option = prefix + "DISPLAY_NAME";
  if (this->IsSetToEmpty(option)) {
    this->DisplayName.clear();
  } else if (cmValue value = this->GetOption(option)) {
    cmCPackIFWPackage::ExpandListArgument(*value, this->DisplayName);
  }

  // Description
  option = prefix + "DESCRIPTION";
  if (this->IsSetToEmpty(option)) {
    this->Description.clear();
  } else if (cmValue value = this->GetOption(option)) {
    cmCPackIFWPackage::ExpandListArgument(*value, this->Description);
  }

  // Release date
  option = prefix + "RELEASE_DATE";
  if (this->IsSetToEmpty(option)) {
    this->ReleaseDate.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->ReleaseDate = *value;
  }

  // Sorting priority
  option = prefix + "SORTING_PRIORITY";
  if (this->IsSetToEmpty(option)) {
    this->SortingPriority.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->SortingPriority = *value;
  }

  // Update text
  option = prefix + "UPDATE_TEXT";
  if (this->IsSetToEmpty(option)) {
    this->UpdateText.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->UpdateText = *value;
  }

  // Translations
  option = prefix + "TRANSLATIONS";
  if (this->IsSetToEmpty(option)) {
    this->Translations.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->Translations.clear();
    cmExpandList(value, this->Translations);
  }

  // QtIFW dependencies
  cmList deps;
  option = prefix + "DEPENDS";
  if (cmValue value = this->GetOption(option)) {
    deps.assign(value);
  }
  option = prefix + "DEPENDENCIES";
  if (cmValue value = this->GetOption(option)) {
    deps.append(value);
  }
  for (auto const& d : deps) {
    DependenceStruct dep(d);
    if (this->Generator->Packages.count(dep.Name)) {
      cmCPackIFWPackage& depPkg = this->Generator->Packages[dep.Name];
      dep.Name = depPkg.Name;
    }
    bool hasDep = this->Generator->DependentPackages.count(dep.Name) > 0;
    DependenceStruct& depRef = this->Generator->DependentPackages[dep.Name];
    if (!hasDep) {
      depRef = dep;
    }
    this->AlienDependencies.insert(&depRef);
  }

  // Automatic dependency on
  option = prefix + "AUTO_DEPEND_ON";
  if (this->IsSetToEmpty(option)) {
    this->AlienAutoDependOn.clear();
  } else if (cmValue value = this->GetOption(option)) {
    cmList depsOn{ value };
    for (std::string const& d : depsOn) {
      DependenceStruct dep(d);
      if (this->Generator->Packages.count(dep.Name)) {
        cmCPackIFWPackage& depPkg = this->Generator->Packages[dep.Name];
        dep.Name = depPkg.Name;
      }
      bool hasDep = this->Generator->DependentPackages.count(dep.Name) > 0;
      DependenceStruct& depRef = this->Generator->DependentPackages[dep.Name];
      if (!hasDep) {
        depRef = dep;
      }
      this->AlienAutoDependOn.insert(&depRef);
    }
  }

  // Visibility
  option = prefix + "VIRTUAL";
  if (this->IsSetToEmpty(option)) {
    this->Virtual.clear();
  } else if (this->IsOn(option)) {
    this->Virtual = "true";
  }

  // Default selection
  option = prefix + "DEFAULT";
  if (this->IsSetToEmpty(option)) {
    this->Default.clear();
  } else if (cmValue value = this->GetOption(option)) {
    std::string lowerValue = cmsys::SystemTools::LowerCase(*value);
    if (lowerValue == "true") {
      this->Default = "true";
    } else if (lowerValue == "false") {
      this->Default = "false";
    } else if (lowerValue == "script") {
      this->Default = "script";
    } else {
      this->Default = *value;
    }
  }

  // Forsed installation
  option = prefix + "FORCED_INSTALLATION";
  if (this->IsSetToEmpty(option)) {
    this->ForcedInstallation.clear();
  } else if (this->IsOn(option)) {
    this->ForcedInstallation = "true";
  } else if (this->IsSetToOff(option)) {
    this->ForcedInstallation = "false";
  }

  // Replaces
  option = prefix + "REPLACES";
  if (this->IsSetToEmpty(option)) {
    this->Replaces.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->Replaces.clear();
    cmExpandList(value, this->Replaces);
  }

  // Requires admin rights
  option = prefix + "REQUIRES_ADMIN_RIGHTS";
  if (this->IsSetToEmpty(option)) {
    this->RequiresAdminRights.clear();
  } else if (this->IsOn(option)) {
    this->RequiresAdminRights = "true";
  } else if (this->IsSetToOff(option)) {
    this->RequiresAdminRights = "false";
  }

  // Checkable
  option = prefix + "CHECKABLE";
  if (this->IsSetToEmpty(option)) {
    this->Checkable.clear();
  } else if (this->IsOn(option)) {
    this->Checkable = "true";
  } else if (this->IsSetToOff(option)) {
    this->Checkable = "false";
  }

  return 1;
}